

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O2

int check_times(testing t,char *id,nsync_time start_time,nsync_time expected_duration,
               nsync_time slop_duration)

{
  int iVar1;
  uint uVar2;
  char *__ptr;
  char *__ptr_00;
  char *msg;
  nsync_time nVar3;
  nsync_time nVar4;
  
  nVar3 = nsync::nsync_time_now();
  nVar3 = nsync::nsync_time_sub(nVar3,start_time);
  nVar4 = nsync::nsync_time_ms(5);
  nVar4 = nsync::nsync_time_sub(expected_duration,nVar4);
  iVar1 = nsync::nsync_time_cmp(nVar3,nVar4);
  if (iVar1 < 0) {
    __ptr = nsync_time_str(nVar3,2);
    __ptr_00 = nsync_time_str(expected_duration,2);
    msg = smprintf("check_times %s too short a delay: %s instead of %s",id,__ptr,__ptr_00);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/mu_test.c"
                   ,0x1d4,msg);
    free(__ptr);
    free(__ptr_00);
  }
  nVar4 = nsync::nsync_time_add(expected_duration,slop_duration);
  uVar2 = nsync::nsync_time_cmp(nVar4,nVar3);
  return uVar2 >> 0x1f;
}

Assistant:

static int check_times (testing t, const char *id, nsync_time start_time,
			nsync_time expected_duration, nsync_time slop_duration) {
	int exceeds_count = 0;
	nsync_time now;
	nsync_time measured_duration;
	now = nsync_time_now ();
	measured_duration = nsync_time_sub (now, start_time);
	if (nsync_time_cmp (measured_duration,
			    nsync_time_sub (expected_duration, nsync_time_ms (5))) < 0) {
		char *m_str = nsync_time_str (measured_duration, 2);
		char *e_str = nsync_time_str (expected_duration, 2);
		TEST_ERROR (t, ("check_times %s too short a delay: %s instead of %s",
			   id, m_str, e_str));
		free (m_str);
		free (e_str);
	}
	if (nsync_time_cmp (nsync_time_add (expected_duration, slop_duration), measured_duration) < 0) {
		exceeds_count++;
	}
	return (exceeds_count);
}